

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O3

void __thiscall de::anon_unknown_0::TestThread::run(TestThread *this)

{
  SpinBarrier *pSVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Random rnd;
  WaitMode local_44;
  deRandom local_40;
  
  uVar3 = ((uint)this->m_numThreads >> 0x10 ^ this->m_numThreads ^ 0x3d) * 9;
  uVar2 = ((uint)this->m_threadNdx >> 0x10 ^ this->m_threadNdx ^ 0x3d) * 9;
  uVar3 = (uVar2 >> 4 ^ uVar2) * 0x27d4eb2d ^ (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar3 >> 0xf ^ uVar3);
  iVar4 = 10000;
  do {
    LOCK();
    *this->m_sharedVar = *this->m_sharedVar + 1;
    UNLOCK();
    pSVar1 = this->m_barrier;
    local_44 = WAIT_MODE_BUSY;
    Random::choose<de::SpinBarrier::WaitMode_const*,de::SpinBarrier::WaitMode*>
              ((Random *)&local_40,
               (WaitMode *)
               de::(anonymous_namespace)::TestThread::getWaitMode(de::Random&)::s_allModes,
               (WaitMode *)
               (de::(anonymous_namespace)::TestThread::getWaitMode(de::Random&)::s_allModes +
               (ulong)this->m_busyOk * 4 + 8),&local_44,1);
    SpinBarrier::sync(pSVar1);
    if (*this->m_sharedVar != this->m_numThreads) {
      deAssertFail("*m_sharedVar == m_numThreads",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deSpinBarrier.cpp"
                   ,0xc5);
    }
    pSVar1 = this->m_barrier;
    local_44 = WAIT_MODE_BUSY;
    Random::choose<de::SpinBarrier::WaitMode_const*,de::SpinBarrier::WaitMode*>
              ((Random *)&local_40,
               (WaitMode *)
               de::(anonymous_namespace)::TestThread::getWaitMode(de::Random&)::s_allModes,
               (WaitMode *)
               (de::(anonymous_namespace)::TestThread::getWaitMode(de::Random&)::s_allModes +
               (ulong)this->m_busyOk * 4 + 8),&local_44,1);
    SpinBarrier::sync(pSVar1);
    LOCK();
    *this->m_sharedVar = *this->m_sharedVar + -1;
    UNLOCK();
    pSVar1 = this->m_barrier;
    local_44 = WAIT_MODE_BUSY;
    Random::choose<de::SpinBarrier::WaitMode_const*,de::SpinBarrier::WaitMode*>
              ((Random *)&local_40,
               (WaitMode *)
               de::(anonymous_namespace)::TestThread::getWaitMode(de::Random&)::s_allModes,
               (WaitMode *)
               (de::(anonymous_namespace)::TestThread::getWaitMode(de::Random&)::s_allModes +
               (ulong)this->m_busyOk * 4 + 8),&local_44,1);
    SpinBarrier::sync(pSVar1);
    if (*this->m_sharedVar != 0) {
      deAssertFail("*m_sharedVar == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deSpinBarrier.cpp"
                   ,0xcf);
    }
    pSVar1 = this->m_barrier;
    local_44 = WAIT_MODE_BUSY;
    Random::choose<de::SpinBarrier::WaitMode_const*,de::SpinBarrier::WaitMode*>
              ((Random *)&local_40,
               (WaitMode *)
               de::(anonymous_namespace)::TestThread::getWaitMode(de::Random&)::s_allModes,
               (WaitMode *)
               (de::(anonymous_namespace)::TestThread::getWaitMode(de::Random&)::s_allModes +
               (ulong)this->m_busyOk * 4 + 8),&local_44,1);
    SpinBarrier::sync(pSVar1);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

void run (void)
	{
		const int	numIters	= 10000;
		de::Random	rnd			(deInt32Hash(m_numThreads) ^ deInt32Hash(m_threadNdx));

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Phase 1: count up
			deAtomicIncrement32(m_sharedVar);

			// Verify
			m_barrier.sync(getWaitMode(rnd));

			DE_TEST_ASSERT(*m_sharedVar == m_numThreads);

			m_barrier.sync(getWaitMode(rnd));

			// Phase 2: count down
			deAtomicDecrement32(m_sharedVar);

			// Verify
			m_barrier.sync(getWaitMode(rnd));

			DE_TEST_ASSERT(*m_sharedVar == 0);

			m_barrier.sync(getWaitMode(rnd));
		}
	}